

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp2.c
# Opt level: O1

MPP_RET vdpp2_control(VdppCtx ictx,VdppCmd cmd,void *iparam)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  MPP_RET MVar6;
  size_t __n;
  void *__dest;
  
  if ((ictx == (VdppCtx)0x0) || (cmd != VDPP_CMD_RUN_SYNC && iparam == (void *)0x0)) {
    _mpp_log_l(2,"vdpp2","found NULL iparam %p cmd %d ctx %p\n","vdpp2_control",iparam,cmd,ictx);
    return MPP_ERR_NULL_PTR;
  }
  if (0xfff < (int)cmd) {
    switch(cmd) {
    case VDPP_CMD_SET_COM2_CFG:
    case VDPP_CMD_SET_ES:
    case VDPP_CMD_SET_DCI_HIST:
    case VDPP_CMD_SET_SHARP:
      goto switchD_0010d385_caseD_2000;
    case VDPP_CMD_SET_DST_C:
      *(undefined4 *)((long)ictx + 0x68) = *iparam;
      *(undefined4 *)((long)ictx + 0x6c) = *(undefined4 *)((long)iparam + 4);
      *(undefined4 *)((long)ictx + 0x70) = *(undefined4 *)((long)iparam + 8);
      return MPP_OK;
    case VDPP_CMD_SET_HIST_FD:
      *(undefined4 *)((long)ictx + 0x74) = *iparam;
      return MPP_OK;
    default:
      if (cmd != VDPP_CMD_RUN_SYNC) {
        return MPP_OK;
      }
      MVar6 = vdpp2_start((vdpp2_api_ctx *)ictx);
      if (MVar6 != MPP_OK) {
        _mpp_log_l(2,"vdpp2","run vdpp failed\n","vdpp2_control");
        return MPP_NOK;
      }
      vdpp2_wait((vdpp2_api_ctx *)ictx);
      vdpp2_done((vdpp2_api_ctx *)ictx);
      return MPP_OK;
    }
  }
  if ((int)cmd < 0x100) {
    if (cmd == VDPP_CMD_SET_SRC) {
      *(undefined4 *)((long)ictx + 0x50) = *iparam;
      *(undefined4 *)((long)ictx + 0x54) = *(undefined4 *)((long)iparam + 4);
      *(undefined4 *)((long)ictx + 0x58) = *(undefined4 *)((long)iparam + 8);
      return MPP_OK;
    }
    if (cmd == VDPP_CMD_SET_DST) {
      *(undefined4 *)((long)ictx + 0x5c) = *iparam;
      *(undefined4 *)((long)ictx + 0x60) = *(undefined4 *)((long)iparam + 4);
      *(undefined4 *)((long)ictx + 100) = *(undefined4 *)((long)iparam + 8);
      return MPP_OK;
    }
    if (cmd != VDPP_CMD_SET_COM_CFG) {
      return MPP_OK;
    }
  }
  else if ((1 < cmd - VDPP_CMD_SET_ZME_COM_CFG) && (cmd != VDPP_CMD_SET_DMSR_CFG)) {
    return MPP_OK;
  }
switchD_0010d385_caseD_2000:
  if (0x13 < *iparam) {
    return MPP_OK;
  }
  switch(*iparam) {
  case 0:
    *(undefined4 *)((long)ictx + 0x728) = 0;
    *(undefined4 *)((long)ictx + 8) = 3;
    *(undefined4 *)((long)ictx + 0xc) = *(undefined4 *)((long)iparam + 8);
    *(undefined4 *)((long)ictx + 0x10) = *(undefined4 *)((long)iparam + 0xc);
    *(undefined4 *)((long)ictx + 0x14) = *(undefined4 *)((long)iparam + 0x10);
    iVar1 = *(int *)((long)iparam + 0x14);
    *(int *)((long)ictx + 0x18) = iVar1;
    iVar2 = *(int *)((long)iparam + 0x18);
    *(int *)((long)ictx + 0x1c) = iVar2;
    iVar3 = *(int *)((long)iparam + 0x1c);
    *(int *)((long)ictx + 0x28) = iVar3;
    iVar4 = *(int *)((long)iparam + 0x20);
    *(int *)((long)ictx + 0x2c) = iVar4;
    *(undefined1 *)((long)ictx + 0x78) = 1;
    *(undefined4 *)((long)ictx + 0x148) = 1;
    *(undefined4 *)((long)ictx + 0x1d4) = 1;
    if (*(int *)((long)ictx + 0x20) == 0) {
      *(uint *)((long)ictx + 0x20) = iVar1 + 0xfU & 0xfffffff0;
    }
    if (*(int *)((long)ictx + 0x24) == 0) {
      *(uint *)((long)ictx + 0x24) = iVar2 + 7U & 0xfffffff8;
    }
    if (iVar3 == 0) {
      *(int *)((long)ictx + 0x28) = iVar1;
    }
    if (iVar4 == 0) {
      *(int *)((long)ictx + 0x2c) = iVar2;
    }
    if (*(int *)((long)ictx + 0x30) == 0) {
      *(uint *)((long)ictx + 0x30) = *(int *)((long)ictx + 0x28) + 0xfU & 0xfffffff0;
    }
    if (*(int *)((long)ictx + 0x34) == 0) {
      *(uint *)((long)ictx + 0x34) = *(int *)((long)ictx + 0x2c) + 1U & 0xfffffffe;
    }
    if (*(int *)((long)ictx + 0x3c) == 0) {
      *(undefined4 *)((long)ictx + 0x3c) = *(undefined4 *)((long)ictx + 0x28);
    }
    if (*(int *)((long)ictx + 0x44) == 0) {
      *(uint *)((long)ictx + 0x44) = *(int *)((long)ictx + 0x3c) + 0xfU & 0xfffffff0;
    }
    if (*(int *)((long)ictx + 0x40) == 0) {
      *(undefined4 *)((long)ictx + 0x40) = *(undefined4 *)((long)ictx + 0x2c);
    }
    if (*(int *)((long)ictx + 0x48) == 0) {
      *(uint *)((long)ictx + 0x48) = *(int *)((long)ictx + 0x40) + 1U & 0xfffffffe;
    }
    goto LAB_0010d7a2;
  case 1:
    __dest = (void *)((long)ictx + 0x78);
    __n = 0x84;
    goto LAB_0010d64c;
  case 2:
    *(uint *)((long)ictx + 0x100) = (uint)*(byte *)((long)iparam + 8);
    *(uint *)((long)ictx + 0x104) = (uint)*(byte *)((long)iparam + 9);
    *(undefined4 *)((long)ictx + 0x108) = *(undefined4 *)((long)iparam + 0xc);
    *(undefined4 *)((long)ictx + 0x10c) = *(undefined4 *)((long)iparam + 0x10);
    *(undefined4 *)((long)ictx + 0x110) = *(undefined4 *)((long)iparam + 0x14);
    *(undefined4 *)((long)ictx + 0x114) = *(undefined4 *)((long)iparam + 0x18);
    break;
  case 3:
    if (*(long *)((long)iparam + 0x20) != 0) {
      *(long *)((long)ictx + 0x118) = *(long *)((long)iparam + 0x20);
    }
    if (*(long *)((long)iparam + 0x28) != 0) {
      *(long *)((long)ictx + 0x120) = *(long *)((long)iparam + 0x28);
    }
    break;
  case 0x10:
    uVar5 = *(uint *)((long)iparam + 0x50);
    *(undefined4 *)((long)ictx + 0xc) = *(undefined4 *)((long)iparam + 0xc);
    *(undefined4 *)((long)ictx + 8) = *(undefined4 *)((long)iparam + 8);
    *(undefined4 *)((long)ictx + 0x10) = *(undefined4 *)((long)iparam + 0x10);
    *(undefined4 *)((long)ictx + 0x14) = *(undefined4 *)((long)iparam + 0x14);
    *(undefined4 *)((long)ictx + 0x18) = *(undefined4 *)((long)iparam + 0x18);
    *(undefined4 *)((long)ictx + 0x1c) = *(undefined4 *)((long)iparam + 0x1c);
    *(undefined4 *)((long)ictx + 0x20) = *(undefined4 *)((long)iparam + 0x20);
    *(undefined4 *)((long)ictx + 0x24) = *(undefined4 *)((long)iparam + 0x24);
    *(undefined4 *)((long)ictx + 0x28) = *(undefined4 *)((long)iparam + 0x28);
    *(undefined4 *)((long)ictx + 0x2c) = *(undefined4 *)((long)iparam + 0x2c);
    *(undefined4 *)((long)ictx + 0x30) = *(undefined4 *)((long)iparam + 0x30);
    *(undefined4 *)((long)ictx + 0x34) = *(undefined4 *)((long)iparam + 0x34);
    *(undefined4 *)((long)ictx + 0x38) = *(undefined4 *)((long)iparam + 0x38);
    *(undefined4 *)((long)ictx + 0x3c) = *(undefined4 *)((long)iparam + 0x3c);
    *(undefined4 *)((long)ictx + 0x40) = *(undefined4 *)((long)iparam + 0x40);
    *(undefined4 *)((long)ictx + 0x44) = *(undefined4 *)((long)iparam + 0x44);
    *(undefined4 *)((long)ictx + 0x48) = *(undefined4 *)((long)iparam + 0x48);
    *(uint *)((long)ictx + 0x4c) = 3 - (uint)(*(int *)((long)iparam + 0x4c) == 0);
    if ((uVar5 >> 0x12 & 1) != 0) {
      *(byte *)((long)ictx + 0x78) = (byte)uVar5 >> 2 & 1;
    }
    if ((uVar5 >> 0x11 & 1) != 0) {
      *(uint *)((long)ictx + 0x148) = uVar5 >> 1 & 1;
    }
    if ((uVar5 >> 0x10 & 1) != 0) {
      *(uint *)((long)ictx + 0x1d4) = uVar5 & 1;
    }
    goto LAB_0010d7a2;
  case 0x11:
    memcpy((EsParams *)((long)ictx + 0x148),(void *)((long)iparam + 8),0x8c);
    update_es_tan((EsParams *)((long)ictx + 0x148));
    break;
  case 0x12:
    *(undefined4 *)((long)ictx + 0x728) = *(undefined4 *)((long)iparam + 8);
    *(undefined4 *)((long)ictx + 0x72c) = *(undefined4 *)((long)iparam + 0xc);
    *(undefined4 *)((long)ictx + 0x730) = *(undefined4 *)((long)iparam + 0x10);
    *(undefined4 *)((long)ictx + 0x734) = *(undefined4 *)((long)iparam + 0x14);
    *(undefined4 *)((long)ictx + 0x738) = *(undefined4 *)((long)iparam + 0x18);
    *(undefined4 *)((long)ictx + 0x748) = *(undefined4 *)((long)iparam + 0x1c);
LAB_0010d7a2:
    update_dci_ctl((vdpp2_params *)((long)ictx + 8));
    break;
  case 0x13:
    __dest = (void *)((long)ictx + 0x1d4);
    __n = 0x554;
LAB_0010d64c:
    memcpy(__dest,(void *)((long)iparam + 8),__n);
  }
  return MPP_OK;
}

Assistant:

MPP_RET vdpp2_control(VdppCtx ictx, VdppCmd cmd, void *iparam)
{
    struct vdpp2_api_ctx *ctx = ictx;
    MPP_RET ret = MPP_OK;

    if ((NULL == iparam && VDPP_CMD_RUN_SYNC != cmd) ||
        (NULL == ictx)) {
        mpp_err_f("found NULL iparam %p cmd %d ctx %p\n", iparam, cmd, ictx);
        return MPP_ERR_NULL_PTR;
    }

    switch (cmd) {
    case VDPP_CMD_SET_COM_CFG:
    case VDPP_CMD_SET_DMSR_CFG:
    case VDPP_CMD_SET_ZME_COM_CFG:
    case VDPP_CMD_SET_ZME_COEFF_CFG:
    case VDPP_CMD_SET_COM2_CFG:
    case VDPP_CMD_SET_ES:
    case VDPP_CMD_SET_DCI_HIST:
    case VDPP_CMD_SET_SHARP: {
        struct vdpp_api_params *param = (struct vdpp_api_params *)iparam;

        ret = vdpp2_set_param(ctx, &param->param, param->ptype);
        if (ret) {
            mpp_err_f("set vdpp parameter failed, type %d\n", param->ptype);
        }
        break;
    }
    case VDPP_CMD_SET_SRC:
        set_addr(&ctx->params.src, (VdppImg *)iparam);
        break;
    case VDPP_CMD_SET_DST:
        set_addr(&ctx->params.dst, (VdppImg *)iparam);
        break;
    case VDPP_CMD_SET_DST_C:
        set_addr(&ctx->params.dst_c, (VdppImg *)iparam);
        break;
    case VDPP_CMD_SET_HIST_FD:
        ctx->params.hist = *(RK_S32 *)iparam;
        break;
    case VDPP_CMD_RUN_SYNC:
        ret = vdpp2_start(ctx);
        if (ret) {
            mpp_err_f("run vdpp failed\n");
            return MPP_NOK;
        }

        vdpp2_wait(ctx);
        vdpp2_done(ctx);
        break;
    default:
        ;
    }

    return ret;
}